

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

char * __thiscall
cmCommandArgumentParserHelper::ExpandSpecialVariable
          (cmCommandArgumentParserHelper *this,char *key,char *var)

{
  int iVar1;
  ostream *poVar2;
  cmState *this_00;
  char *pcVar3;
  string *this_01;
  ostringstream e;
  allocator local_1b1;
  string local_1b0;
  string local_190 [11];
  
  if (key == (char *)0x0) {
    pcVar3 = ExpandVariable(this,var);
    return pcVar3;
  }
  if (var == (char *)0x0) {
    return this->EmptyVariable;
  }
  iVar1 = strcmp(key,"ENV");
  if (iVar1 == 0) {
    pcVar3 = getenv(var);
    if (pcVar3 == (char *)0x0) {
      return this->EmptyVariable;
    }
    if (this->EscapeQuotes != true) {
      return pcVar3;
    }
    std::__cxx11::string::string((string *)&local_1b0,pcVar3,&local_1b1);
    cmSystemTools::EscapeQuotes(local_190,&local_1b0);
    pcVar3 = AddString(this,local_190);
  }
  else {
    iVar1 = strcmp(key,"CACHE");
    if (iVar1 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      poVar2 = std::operator<<((ostream *)local_190,"Syntax $");
      poVar2 = std::operator<<(poVar2,key);
      poVar2 = std::operator<<(poVar2,"{} is not supported.  ");
      std::operator<<(poVar2,"Only ${}, $ENV{}, and $CACHE{} are allowed.");
      std::__cxx11::stringbuf::str();
      SetError(this,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
      return (char *)0x0;
    }
    this_00 = cmMakefile::GetState(this->Makefile);
    std::__cxx11::string::string((string *)local_190,var,(allocator *)&local_1b0);
    pcVar3 = cmState::GetInitializedCacheValue(this_00,local_190);
    std::__cxx11::string::~string((string *)local_190);
    if (pcVar3 == (char *)0x0) {
      return this->EmptyVariable;
    }
    if (this->EscapeQuotes != true) {
      std::__cxx11::string::string((string *)local_190,pcVar3,(allocator *)&local_1b0);
      pcVar3 = AddString(this,local_190);
      this_01 = local_190;
      goto LAB_0038090e;
    }
    std::__cxx11::string::string((string *)&local_1b0,pcVar3,&local_1b1);
    cmSystemTools::EscapeQuotes(local_190,&local_1b0);
    pcVar3 = AddString(this,local_190);
  }
  std::__cxx11::string::~string((string *)local_190);
  this_01 = &local_1b0;
LAB_0038090e:
  std::__cxx11::string::~string((string *)this_01);
  return pcVar3;
}

Assistant:

char* cmCommandArgumentParserHelper::ExpandSpecialVariable(const char* key,
                                                           const char* var)
{
  if ( !key )
    {
    return this->ExpandVariable(var);
    }
  if(!var)
    {
    return this->EmptyVariable;
    }
  if ( strcmp(key, "ENV") == 0 )
    {
    char *ptr = getenv(var);
    if (ptr)
      {
      if (this->EscapeQuotes)
        {
        return this->AddString(cmSystemTools::EscapeQuotes(ptr));
        }
      else
        {
        return ptr;
        }
      }
    return this->EmptyVariable;
    }
  if ( strcmp(key, "CACHE") == 0 )
    {
    if(const char* c = this->Makefile->GetState()
                           ->GetInitializedCacheValue(var))
      {
      if(this->EscapeQuotes)
        {
        return this->AddString(cmSystemTools::EscapeQuotes(c));
        }
      else
        {
        return this->AddString(c);
        }
      }
    return this->EmptyVariable;
    }
  std::ostringstream e;
  e << "Syntax $" << key << "{} is not supported.  "
    << "Only ${}, $ENV{}, and $CACHE{} are allowed.";
  this->SetError(e.str());
  return 0;
}